

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

char * stringify_argv(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  ulong uVar8;
  size_t __size;
  
  __size = 1;
  if (0 < argc) {
    uVar8 = 0;
    do {
      sVar3 = strlen(argv[uVar8]);
      __size = __size + sVar3 + 1;
      uVar8 = uVar8 + 1;
    } while ((uint)argc != uVar8);
  }
  pcVar4 = (char *)malloc(__size);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar5 = pcVar4;
    if (0 < argc) {
      uVar8 = 0;
      pcVar2 = pcVar4;
      do {
        pcVar5 = pcVar2;
        lVar6 = 1;
        while( true ) {
          cVar1 = argv[uVar8][lVar6 + -1];
          cVar7 = ' ';
          if ((cVar1 != '\t') && (cVar7 = cVar1, cVar1 == '\0')) break;
          pcVar5[lVar6 + -1] = cVar7;
          lVar6 = lVar6 + 1;
        }
        pcVar5[lVar6 + -1] = ' ';
        uVar8 = uVar8 + 1;
        pcVar2 = pcVar5 + lVar6;
      } while (uVar8 != (uint)argc);
      pcVar5 = pcVar5 + lVar6;
    }
    *pcVar5 = '\0';
  }
  return pcVar4;
}

Assistant:

char *stringify_argv(int argc, char *argv[]) {
    char *str, *cp;
    size_t nbytes = 1;
    int i, j;

    /* Allocate */
    for (i = 0; i < argc; i++) {
	nbytes += strlen(argv[i]) + 1;
    }
    if (!(str = malloc(nbytes)))
	return NULL;

    /* Copy */
    cp = str;
    for (i = 0; i < argc; i++) {
	j = 0;
	while (argv[i][j]) {
	    if (argv[i][j] == '\t')
		*cp++ = ' ';
	    else
		*cp++ = argv[i][j];
	    j++;
	}
	*cp++ = ' ';
    }
    *cp++ = 0;

    return str;
}